

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

char * __thiscall CaDiCaL::Parser::parse_lit(Parser *this,int *ch,int *lit,int *vars,int strict)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  uint *in_RCX;
  uint *in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  int digit;
  int sign;
  int local_30;
  char *local_8;
  
  if (*in_RSI == 0x61) {
    local_8 = cube_token;
  }
  else {
    if (*in_RSI == 0x2d) {
      iVar2 = parse_char((Parser *)0xe02c27);
      *in_RSI = iVar2;
      iVar2 = isdigit(iVar2);
      if (iVar2 == 0) {
        lVar1 = *(long *)(in_RDI + 8);
        File::name(*(File **)(in_RDI + 0x18));
        File::lineno(*(File **)(in_RDI + 0x18));
        Format::init((Format *)(lVar1 + 0x1c18),(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
        pcVar3 = Format::append((Format *)(*(long *)(in_RDI + 8) + 0x1c18),
                                "expected digit after \'-\'");
        return pcVar3;
      }
      local_30 = -1;
    }
    else {
      iVar2 = isdigit(*in_RSI);
      if (iVar2 == 0) {
        lVar1 = *(long *)(in_RDI + 8);
        File::name(*(File **)(in_RDI + 0x18));
        File::lineno(*(File **)(in_RDI + 0x18));
        Format::init((Format *)(lVar1 + 0x1c18),(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
        pcVar3 = Format::append((Format *)(*(long *)(in_RDI + 8) + 0x1c18),"expected digit or \'-\'"
                               );
        return pcVar3;
      }
      local_30 = 1;
    }
    *in_RDX = *in_RSI - 0x30;
    while( true ) {
      iVar2 = parse_char((Parser *)0xe02d7e);
      *in_RSI = iVar2;
      iVar2 = isdigit(iVar2);
      if (iVar2 == 0) break;
      if ((0xccccccc < (int)*in_RDX) ||
         (iVar2 = 0x7fffffff - (*in_RSI + -0x30),
         SBORROW4(iVar2,*in_RDX * 10) != (int)(iVar2 + *in_RDX * -10) < 0)) {
        lVar1 = *(long *)(in_RDI + 8);
        File::name(*(File **)(in_RDI + 0x18));
        File::lineno(*(File **)(in_RDI + 0x18));
        Format::init((Format *)(lVar1 + 0x1c18),(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
        pcVar3 = Format::append((Format *)(*(long *)(in_RDI + 8) + 0x1c18),"literal too large");
        return pcVar3;
      }
      *in_RDX = *in_RDX * 10 + *in_RSI + -0x30;
    }
    if (*in_RSI == 0xd) {
      iVar2 = parse_char((Parser *)0xe02e77);
      *in_RSI = iVar2;
    }
    if ((((*in_RSI == 99) || (*in_RSI == 0x20)) || (*in_RSI == 9)) ||
       ((*in_RSI == 10 || (*in_RSI == -1)))) {
      if ((int)*in_RCX < (int)*in_RDX) {
        if (in_R8D != 0) {
          lVar1 = *(long *)(in_RDI + 8);
          File::name(*(File **)(in_RDI + 0x18));
          File::lineno(*(File **)(in_RDI + 0x18));
          Format::init((Format *)(lVar1 + 0x1c18),(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
          pcVar3 = Format::append((Format *)(*(long *)(in_RDI + 8) + 0x1c18),
                                  "literal %d exceeds maximum variable %d",
                                  (ulong)(local_30 * *in_RDX),(ulong)*in_RCX);
          return pcVar3;
        }
        *in_RCX = *in_RDX;
      }
      *in_RDX = local_30 * *in_RDX;
      local_8 = (char *)0x0;
    }
    else {
      lVar1 = *(long *)(in_RDI + 8);
      File::name(*(File **)(in_RDI + 0x18));
      File::lineno(*(File **)(in_RDI + 0x18));
      Format::init((Format *)(lVar1 + 0x1c18),(EVP_PKEY_CTX *)"%s:%lu: parse error: ");
      local_8 = Format::append((Format *)(*(long *)(in_RDI + 8) + 0x1c18),
                               "expected white space after \'%d\'",(ulong)(local_30 * *in_RDX));
    }
  }
  return local_8;
}

Assistant:

inline const char *Parser::parse_lit (int &ch, int &lit, int &vars,
                                      int strict) {
  if (ch == 'a')
    return cube_token;
  int sign = 0;
  if (ch == '-') {
    if (!isdigit (ch = parse_char ()))
      PER ("expected digit after '-'");
    sign = -1;
  } else if (!isdigit (ch))
    PER ("expected digit or '-'");
  else
    sign = 1;
  lit = ch - '0';
  while (isdigit (ch = parse_char ())) {
    int digit = ch - '0';
    if (INT_MAX / 10 < lit || INT_MAX - digit < 10 * lit)
      PER ("literal too large");
    lit = 10 * lit + digit;
  }
  if (ch == '\r')
    ch = parse_char ();
  if (ch != 'c' && ch != ' ' && ch != '\t' && ch != '\n' && ch != EOF)
    PER ("expected white space after '%d'", sign * lit);
  if (lit > vars) {
    if (strict != FORCED)
      PER ("literal %d exceeds maximum variable %d", sign * lit, vars);
    else
      vars = lit;
  }
  lit *= sign;
  return 0;
}